

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O1

void __thiscall
Pl_Flate::Pl_Flate(Pl_Flate *this,char *identifier,Pipeline *next,action_e action,
                  uint out_bufsize_int)

{
  Members *this_00;
  logic_error *this_01;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Flate_002ef508;
  this_00 = (Members *)operator_new(0x58);
  Members::Members(this_00,(ulong)out_bufsize_int,action);
  (this->m)._M_t.super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>.
  _M_t.super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
  super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl = this_00;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Attempt to create Pl_Flate with nullptr as next");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_Flate::Pl_Flate(
    char const* identifier, Pipeline* next, action_e action, unsigned int out_bufsize_int) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(QIntC::to_size(out_bufsize_int), action))
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Flate with nullptr as next");
    }
}